

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecodeOperandMemory
          (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,ZydisRegisterClass vidx_register_class)

{
  byte bVar1;
  byte bVar2;
  ZyanU8 ZVar3;
  ZydisRegisterEncoding ZVar4;
  ZydisRegister ZVar5;
  ZydisRegisterClass local_80;
  ZydisRegisterClass local_60;
  ZydisRegisterClass local_58;
  ZydisRegisterClass local_38;
  ZyanU8 local_26;
  ZyanU8 displacement_size;
  ZyanU8 modrm_rm;
  ZydisRegisterClass vidx_register_class_local;
  ZydisDecodedOperand *operand_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4f1,
                  "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4f2,
                  "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                 );
  }
  if (operand == (ZydisDecodedOperand *)0x0) {
    __assert_fail("operand",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4f3,
                  "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                 );
  }
  if ((instruction->attributes & 1) != 0) {
    if ((instruction->raw).modrm.mod == '\x03') {
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x4f5,
                    "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                   );
    }
    if ((vidx_register_class != ZYDIS_REGCLASS_INVALID) &&
       (((instruction->raw).modrm.rm != '\x04' ||
        ((instruction->address_width != ' ' && (instruction->address_width != '@')))))) {
      __assert_fail("!vidx_register_class || ((instruction->raw.modrm.rm == 4) && ((instruction->address_width == 32) || (instruction->address_width == 64)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x4f7,
                    "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                   );
    }
    operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
    (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MEM;
    bVar1 = (instruction->raw).modrm.rm;
    local_26 = '\0';
    ZVar3 = instruction->address_width;
    if (ZVar3 == '\x10') {
      (operand->field_10).mem.base = ZydisDecodeOperandMemory::bases[bVar1];
      (operand->field_10).mem.index = ZydisDecodeOperandMemory::indices[bVar1];
      (operand->field_10).mem.scale = (operand->field_10).mem.index != ZYDIS_REGISTER_NONE;
      ZVar3 = (instruction->raw).modrm.mod;
      if (ZVar3 == '\0') {
        if (bVar1 == 6) {
          local_26 = '\x10';
          (operand->field_10).mem.base = ZYDIS_REGISTER_NONE;
        }
      }
      else if (ZVar3 == '\x01') {
        local_26 = '\b';
      }
      else {
        if (ZVar3 != '\x02') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x51f,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        local_26 = '\x10';
      }
    }
    else if (ZVar3 == ' ') {
      bVar2 = ZydisCalcRegisterId(context,instruction,ZYDIS_REG_ENCODING_BASE,ZYDIS_REGCLASS_GPR32);
      (operand->field_10).mem.base = bVar2 + ZYDIS_REGISTER_EAX;
      ZVar3 = (instruction->raw).modrm.mod;
      if (ZVar3 == '\0') {
        if (bVar1 == 5) {
          if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            (operand->field_10).mem.base = ZYDIS_REGISTER_EIP;
          }
          else {
            (operand->field_10).mem.base = ZYDIS_REGISTER_NONE;
          }
          local_26 = ' ';
        }
      }
      else if (ZVar3 == '\x01') {
        local_26 = '\b';
      }
      else {
        if (ZVar3 != '\x02') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x53d,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        local_26 = ' ';
      }
      if (bVar1 == 4) {
        if ((instruction->attributes & 2) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x541,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        local_38 = vidx_register_class;
        if (vidx_register_class == ZYDIS_REGCLASS_INVALID) {
          local_38 = ZYDIS_REGCLASS_GPR32;
        }
        ZVar4 = ZYDIS_REG_ENCODING_INDEX;
        if (vidx_register_class == ZYDIS_REGCLASS_INVALID) {
          local_58 = ZYDIS_REGCLASS_GPR32;
        }
        else {
          ZVar4 = ZYDIS_REG_ENCODING_VIDX;
          local_58 = vidx_register_class;
        }
        ZVar3 = ZydisCalcRegisterId(context,instruction,ZVar4,local_58);
        ZVar5 = ZydisRegisterEncode(local_38,ZVar3);
        (operand->field_10).mem.index = ZVar5;
        (operand->field_10).mem.scale = (ZyanU8)(1 << ((instruction->raw).sib.scale & 0x1f));
        if ((operand->field_10).mem.index == ZYDIS_REGISTER_ESP) {
          (operand->field_10).mem.index = ZYDIS_REGISTER_NONE;
          (operand->field_10).mem.scale = '\0';
        }
        if ((operand->field_10).mem.base == ZYDIS_REGISTER_EBP) {
          if ((instruction->raw).modrm.mod == '\0') {
            (operand->field_10).mem.base = ZYDIS_REGISTER_NONE;
          }
          local_26 = ' ';
          if ((instruction->raw).modrm.mod == '\x01') {
            local_26 = '\b';
          }
        }
      }
      else {
        (operand->field_10).mem.index = ZYDIS_REGISTER_NONE;
        (operand->field_10).mem.scale = '\0';
      }
    }
    else {
      if (ZVar3 != '@') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x597,
                      "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                     );
      }
      bVar2 = ZydisCalcRegisterId(context,instruction,ZYDIS_REG_ENCODING_BASE,ZYDIS_REGCLASS_GPR64);
      (operand->field_10).mem.base = bVar2 + ZYDIS_REGISTER_RAX;
      ZVar3 = (instruction->raw).modrm.mod;
      if (ZVar3 == '\0') {
        if (bVar1 == 5) {
          if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            (operand->field_10).mem.base = ZYDIS_REGISTER_RIP;
          }
          else {
            (operand->field_10).mem.base = ZYDIS_REGISTER_NONE;
          }
          local_26 = ' ';
        }
      }
      else if (ZVar3 == '\x01') {
        local_26 = '\b';
      }
      else {
        if (ZVar3 != '\x02') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x576,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        local_26 = ' ';
      }
      if ((bVar1 & 7) == 4) {
        if ((instruction->attributes & 2) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x57a,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        local_60 = vidx_register_class;
        if (vidx_register_class == ZYDIS_REGCLASS_INVALID) {
          local_60 = ZYDIS_REGCLASS_GPR64;
        }
        ZVar4 = ZYDIS_REG_ENCODING_INDEX;
        if (vidx_register_class == ZYDIS_REGCLASS_INVALID) {
          local_80 = ZYDIS_REGCLASS_GPR64;
        }
        else {
          ZVar4 = ZYDIS_REG_ENCODING_VIDX;
          local_80 = vidx_register_class;
        }
        ZVar3 = ZydisCalcRegisterId(context,instruction,ZVar4,local_80);
        ZVar5 = ZydisRegisterEncode(local_60,ZVar3);
        (operand->field_10).mem.index = ZVar5;
        (operand->field_10).mem.scale = (ZyanU8)(1 << ((instruction->raw).sib.scale & 0x1f));
        if ((operand->field_10).mem.index == ZYDIS_REGISTER_RSP) {
          (operand->field_10).mem.index = ZYDIS_REGISTER_NONE;
          (operand->field_10).mem.scale = '\0';
        }
        if (((operand->field_10).mem.base == ZYDIS_REGISTER_RBP) ||
           ((operand->field_10).mem.base == ZYDIS_REGISTER_R13)) {
          if ((instruction->raw).modrm.mod == '\0') {
            (operand->field_10).mem.base = ZYDIS_REGISTER_NONE;
          }
          local_26 = ' ';
          if ((instruction->raw).modrm.mod == '\x01') {
            local_26 = '\b';
          }
        }
      }
      else {
        (operand->field_10).mem.index = ZYDIS_REGISTER_NONE;
        (operand->field_10).mem.scale = '\0';
      }
    }
    if (local_26 != '\0') {
      if ((instruction->raw).disp.size != local_26) {
        __assert_fail("instruction->raw.disp.size == displacement_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x59b,
                      "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                     );
      }
      (operand->field_10).mem.disp.value = (instruction->raw).disp.value;
      *(ZyanU8 *)((long)&operand->field_10 + 0x21) = local_26;
      *(ZyanU8 *)((long)&operand->field_10 + 0x20) = (instruction->raw).disp.offset;
    }
    return 0x100000;
  }
  __assert_fail("instruction->attributes & (1ULL << 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x4f4,
                "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
               );
}

Assistant:

static ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext* context,
    const ZydisDecodedInstruction* instruction, ZydisDecodedOperand* operand,
    ZydisRegisterClass vidx_register_class)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(operand);
    ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_MODRM);
    ZYAN_ASSERT(instruction->raw.modrm.mod != 3);
    ZYAN_ASSERT(!vidx_register_class || ((instruction->raw.modrm.rm == 4) &&
        ((instruction->address_width == 32) || (instruction->address_width == 64))));

    operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
    operand->mem.type = ZYDIS_MEMOP_TYPE_MEM;

    const ZyanU8 modrm_rm = instruction->raw.modrm.rm;
    ZyanU8 displacement_size = 0;
    switch (instruction->address_width)
    {
    case 16:
    {
        static const ZydisRegister bases[] =
        {
            ZYDIS_REGISTER_BX,   ZYDIS_REGISTER_BX,   ZYDIS_REGISTER_BP,   ZYDIS_REGISTER_BP,
            ZYDIS_REGISTER_SI,   ZYDIS_REGISTER_DI,   ZYDIS_REGISTER_BP,   ZYDIS_REGISTER_BX
        };
        static const ZydisRegister indices[] =
        {
            ZYDIS_REGISTER_SI,   ZYDIS_REGISTER_DI,   ZYDIS_REGISTER_SI,   ZYDIS_REGISTER_DI,
            ZYDIS_REGISTER_NONE, ZYDIS_REGISTER_NONE, ZYDIS_REGISTER_NONE, ZYDIS_REGISTER_NONE
        };
        operand->mem.base = bases[modrm_rm];
        operand->mem.index = indices[modrm_rm];
        operand->mem.scale = (operand->mem.index == ZYDIS_REGISTER_NONE) ? 0 : 1;
        switch (instruction->raw.modrm.mod)
        {
        case 0:
            if (modrm_rm == 6)
            {
                displacement_size = 16;
                operand->mem.base = ZYDIS_REGISTER_NONE;
            }
            break;
        case 1:
            displacement_size = 8;
            break;
        case 2:
            displacement_size = 16;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        break;
    }
    case 32:
    {
        operand->mem.base = ZYDIS_REGISTER_EAX + ZydisCalcRegisterId(context, instruction,
            ZYDIS_REG_ENCODING_BASE, ZYDIS_REGCLASS_GPR32);
        switch (instruction->raw.modrm.mod)
        {
        case 0:
            if (modrm_rm == 5)
            {
                if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
                {
                    operand->mem.base = ZYDIS_REGISTER_EIP;
                } else
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = 32;
            }
            break;
        case 1:
            displacement_size = 8;
            break;
        case 2:
            displacement_size = 32;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        if (modrm_rm == 4)
        {
            ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_SIB);
            operand->mem.index =
                ZydisRegisterEncode(vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR32,
                    ZydisCalcRegisterId(context, instruction,
                        vidx_register_class ? ZYDIS_REG_ENCODING_VIDX : ZYDIS_REG_ENCODING_INDEX,
                        vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR32));
            operand->mem.scale = (1 << instruction->raw.sib.scale);
            if (operand->mem.index == ZYDIS_REGISTER_ESP)
            {
                operand->mem.index = ZYDIS_REGISTER_NONE;
                operand->mem.scale = 0;
            }
            if (operand->mem.base == ZYDIS_REGISTER_EBP)
            {
                if (instruction->raw.modrm.mod == 0)
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = (instruction->raw.modrm.mod == 1) ? 8 : 32;
            }
        } else
        {
            operand->mem.index = ZYDIS_REGISTER_NONE;
            operand->mem.scale = 0;
        }
        break;
    }
    case 64:
    {
        operand->mem.base = ZYDIS_REGISTER_RAX + ZydisCalcRegisterId(context, instruction,
            ZYDIS_REG_ENCODING_BASE, ZYDIS_REGCLASS_GPR64);
        switch (instruction->raw.modrm.mod)
        {
        case 0:
            if (modrm_rm == 5)
            {
                if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
                {
                    operand->mem.base = ZYDIS_REGISTER_RIP;
                } else
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = 32;
            }
            break;
        case 1:
            displacement_size = 8;
            break;
        case 2:
            displacement_size = 32;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        if ((modrm_rm & 0x07) == 4)
        {
            ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_SIB);
            operand->mem.index =
                ZydisRegisterEncode(vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR64,
                    ZydisCalcRegisterId(context, instruction,
                        vidx_register_class ? ZYDIS_REG_ENCODING_VIDX : ZYDIS_REG_ENCODING_INDEX,
                        vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR64));
            operand->mem.scale = (1 << instruction->raw.sib.scale);
            if (operand->mem.index == ZYDIS_REGISTER_RSP)
            {
                operand->mem.index = ZYDIS_REGISTER_NONE;
                operand->mem.scale = 0;
            }
            if ((operand->mem.base == ZYDIS_REGISTER_RBP) ||
                (operand->mem.base == ZYDIS_REGISTER_R13))
            {
                if (instruction->raw.modrm.mod == 0)
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = (instruction->raw.modrm.mod == 1) ? 8 : 32;
            }
        } else
        {
            operand->mem.index = ZYDIS_REGISTER_NONE;
            operand->mem.scale = 0;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }
    if (displacement_size)
    {
        ZYAN_ASSERT(instruction->raw.disp.size == displacement_size);
        operand->mem.disp.value = instruction->raw.disp.value;
        operand->mem.disp.size = displacement_size;
        operand->mem.disp.offset = instruction->raw.disp.offset;
    }
    return ZYAN_STATUS_SUCCESS;
}